

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int attach_get_initial_delivery_count
              (ATTACH_HANDLE attach,sequence_no *initial_delivery_count_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  ATTACH_INSTANCE *attach_instance;
  uint32_t item_count;
  int result;
  sequence_no *initial_delivery_count_value_local;
  ATTACH_HANDLE attach_local;
  
  if (attach == (ATTACH_HANDLE)0x0) {
    attach_instance._4_4_ = 0x12c8;
  }
  else {
    _item_count = initial_delivery_count_value;
    initial_delivery_count_value_local = (sequence_no *)attach;
    iVar1 = amqpvalue_get_composite_item_count(attach->composite_value,(uint32_t *)&attach_instance)
    ;
    if (iVar1 == 0) {
      if ((uint)attach_instance < 10) {
        attach_instance._4_4_ = 0x12d6;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(attach->composite_value,9);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          attach_instance._4_4_ = 0x12de;
        }
        else {
          iVar1 = amqpvalue_get_uint(value,_item_count);
          if (iVar1 == 0) {
            attach_instance._4_4_ = 0;
          }
          else {
            attach_instance._4_4_ = 0x12e5;
          }
        }
      }
    }
    else {
      attach_instance._4_4_ = 0x12d0;
    }
  }
  return attach_instance._4_4_;
}

Assistant:

int attach_get_initial_delivery_count(ATTACH_HANDLE attach, sequence_no* initial_delivery_count_value)
{
    int result;

    if (attach == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)attach;
        if (amqpvalue_get_composite_item_count(attach_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 9)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(attach_instance->composite_value, 9);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_sequence_no(item_value, initial_delivery_count_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}